

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamReader.h
# Opt level: O0

uint __thiscall Assimp::StreamReader<true,_true>::Get<unsigned_int>(StreamReader<true,_true> *this)

{
  DeadlyImportError *this_00;
  Getter<true,_unsigned_int,_true> local_4d;
  uint local_4c;
  undefined1 local_45;
  uint f;
  allocator<char> local_31;
  string local_30;
  StreamReader<true,_true> *local_10;
  StreamReader<true,_true> *this_local;
  
  local_10 = this;
  if (this->limit < this->current + 4) {
    local_45 = 1;
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"End of file or stream limit was reached",&local_31);
    DeadlyImportError::DeadlyImportError(this_00,&local_30);
    local_45 = 0;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  local_4c = *(uint *)this->current;
  Intern::Getter<true,_unsigned_int,_true>::operator()(&local_4d,&local_4c,(bool)(this->le & 1));
  this->current = this->current + 4;
  return local_4c;
}

Assistant:

T Get() {
        if ( current + sizeof(T) > limit) {
            throw DeadlyImportError("End of file or stream limit was reached");
        }

        T f;
        ::memcpy (&f, current, sizeof(T));
        Intern::Getter<SwapEndianess,T,RuntimeSwitch>() (&f,le);
        current += sizeof(T);

        return f;
    }